

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modeq_test.cpp
# Opt level: O0

void __thiscall GCD_GcdIsBig_Test::~GCD_GcdIsBig_Test(GCD_GcdIsBig_Test *this)

{
  GCD_GcdIsBig_Test *this_local;
  
  testing::Test::~Test(&this->super_Test);
  return;
}

Assistant:

TEST(GCD, GcdIsBig) {
	rep(i, 0, 1000) {
		ll a = max(lrand48(), 1L), b = lrand48(), c = lrand48();
		ll u, v;
		tie(u, v) = extgcd(a * c, b * c);
		ll g = gcd(a * c, b * c);
		EXPECT_EQ(g, a * u * c + b * v * c);
		EXPECT_EQ((a * c) % g, 0);
		EXPECT_EQ((b * c) % g, 0);
	}

	EXPECT_EQ(gcd(2000000000000000000LL, 3000000000000000000LL), 1000000000000000000LL);
}